

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestCaseEnd
          (PrettyUnitTestResultPrinter *this,TestCase *test_case)

{
  pointer ppTVar1;
  pointer ppTVar2;
  char *pcVar3;
  uint uVar4;
  ulong uVar5;
  String SVar6;
  String counts;
  void *local_40 [2];
  TimeInMillis local_30;
  void *local_28 [2];
  
  if (FLAGS_gtest_print_time == '\x01') {
    String::operator=(&this->test_case_name_,(test_case->name_).c_str_);
    ppTVar2 = (test_case->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppTVar1 = (test_case->test_info_list_).
              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppTVar2 == ppTVar1) {
      pcVar3 = "tests";
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      do {
        uVar4 = (int)uVar5 + (uint)(*ppTVar2)->should_run_;
        uVar5 = (ulong)uVar4;
        ppTVar2 = ppTVar2 + 1;
      } while (ppTVar2 != ppTVar1);
      pcVar3 = "tests";
      if (uVar4 == 1) {
        pcVar3 = "test";
      }
    }
    SVar6 = String::Format((char *)local_28,"%d %s",uVar5,pcVar3);
    ColoredPrintf(COLOR_GREEN,"[----------] ",SVar6.length_);
    pcVar3 = (this->test_case_name_).c_str_;
    local_30 = test_case->elapsed_time_;
    StreamableToString<long_long>((internal *)local_40,&local_30);
    printf("%s from %s (%s ms total)\n\n",local_28[0],pcVar3,local_40[0]);
    if (local_40[0] != (void *)0x0) {
      operator_delete__(local_40[0]);
    }
    fflush(_stdout);
    if (local_28[0] != (void *)0x0) {
      operator_delete__(local_28[0]);
    }
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestCaseEnd(const TestCase& test_case) {
  if (!GTEST_FLAG(print_time)) return;

  test_case_name_ = test_case.name();
  const internal::String counts =
      FormatCountableNoun(test_case.test_to_run_count(), "test", "tests");
  ColoredPrintf(COLOR_GREEN, "[----------] ");
  printf("%s from %s (%s ms total)\n\n",
         counts.c_str(), test_case_name_.c_str(),
         internal::StreamableToString(test_case.elapsed_time()).c_str());
  fflush(stdout);
}